

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertical.cpp
# Opt level: O1

void __thiscall
cppurses::layout::Vertical::distribute_space
          (Vertical *this,
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          *widgets,int height_left)

{
  pointer *ppDVar1;
  size_t sVar2;
  Type TVar3;
  pointer pDVar4;
  ulong uVar5;
  pointer pDVar6;
  pointer pDVar7;
  bool bVar8;
  _Map_pointer ppuVar9;
  _Elt_pointer puVar10;
  _Elt_pointer puVar11;
  _Map_pointer ppuVar12;
  _Map_pointer ppuVar13;
  Dimensions_reference *d;
  pointer pDVar14;
  iterator __end3;
  _Elt_pointer puVar15;
  int iVar16;
  long lVar17;
  pointer pDVar18;
  ulong uVar19;
  Dimensions_reference *d_1;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2;
  deque<unsigned_long,_std::allocator<unsigned_long>_> height_additions;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  double local_90;
  ulong local_88;
  int local_7c;
  double local_78;
  double dStack_70;
  Vertical *local_68;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  local_60;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  local_48;
  
  pDVar14 = (widgets->
            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pDVar4 = (widgets->
           super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar14 == pDVar4) {
    local_78 = 0.0;
    dStack_70 = 0.0;
  }
  else {
    lVar17 = 0;
    do {
      if (((pDVar14->widget->height_policy).type_ & ~Minimum) == Expanding) {
        lVar17 = lVar17 + (pDVar14->widget->height_policy).stretch_;
      }
      pDVar14 = pDVar14 + 1;
    } while (pDVar14 != pDVar4);
    auVar21._8_4_ = (int)((ulong)lVar17 >> 0x20);
    auVar21._0_8_ = lVar17;
    auVar21._12_4_ = 0x45300000;
    dStack_70 = auVar21._8_8_ - 1.9342813113834067e+25;
    local_78 = dStack_70 + ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0);
  }
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = (ulong *)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = (ulong *)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_last = (ulong *)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (ulong *)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (ulong *)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_68 = this;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_e8,0);
  pDVar14 = (widgets->
            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pDVar4 = (widgets->
           super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar20 = pDVar14 == pDVar4;
  if (!bVar20) {
    local_90 = (double)height_left;
    iVar16 = 0;
    do {
      if (((pDVar14->widget->height_policy).type_ & ~Minimum) == Expanding) {
        sVar2 = (pDVar14->widget->height_policy).stretch_;
        auVar22._0_8_ = (double)CONCAT44(0x43300000,(int)sVar2);
        auVar22._8_4_ = (int)(sVar2 >> 0x20);
        auVar22._12_4_ = 0x45300000;
        dVar25 = (((auVar22._8_8_ - 1.9342813113834067e+25) + (auVar22._0_8_ - 4503599627370496.0))
                 / local_78) * local_90;
        local_88 = (ulong)dVar25;
        local_88 = (long)(dVar25 - 9.223372036854776e+18) & (long)local_88 >> 0x3f | local_88;
        if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_push_back_aux<unsigned_long>
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,&local_88);
        }
        else {
          *local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_88;
          local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        uVar19 = *pDVar14->height;
        puVar15 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          puVar15 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        uVar5 = (pDVar14->widget->height_policy).max_;
        if (puVar15[-1] + uVar19 <= uVar5) goto LAB_00144e0d;
        *pDVar14->height = uVar5;
        pDVar6 = (widgets->
                 super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pDVar7 = (widgets->
                 super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pDVar18 = pDVar6 + (long)iVar16 + 1;
        local_7c = height_left;
        if (pDVar18 != pDVar7) {
          memmove(pDVar6 + iVar16,pDVar18,(long)pDVar7 - (long)pDVar18);
        }
        ppDVar1 = &(widgets->
                   super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + -1;
        std::
        vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
        ::vector(&local_48,widgets);
        height_left = local_7c + ((int)uVar5 - (int)uVar19);
        distribute_space(local_68,&local_48,height_left);
        if (local_48.
            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        bVar8 = false;
      }
      else {
LAB_00144e0d:
        iVar16 = iVar16 + 1;
        bVar8 = true;
      }
      if (!bVar8) break;
      pDVar14 = pDVar14 + 1;
      bVar20 = pDVar14 == pDVar4;
    } while (!bVar20);
  }
  if (bVar20) {
    pDVar4 = (widgets->
             super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar14 = (widgets->
                   super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppuVar13 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node,
        ppuVar12 = local_e8._M_impl.super__Deque_impl_data._M_start._M_node,
        puVar11 = local_e8._M_impl.super__Deque_impl_data._M_start._M_last,
        puVar10 = local_e8._M_impl.super__Deque_impl_data._M_start._M_first,
        puVar15 = local_e8._M_impl.super__Deque_impl_data._M_start._M_cur, pDVar14 != pDVar4;
        pDVar14 = pDVar14 + 1) {
      if (((pDVar14->widget->height_policy).type_ & ~Minimum) == Expanding) {
        *pDVar14->height =
             *pDVar14->height + *local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
        height_left = height_left - (int)*local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (local_e8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_e8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_e8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_e8._M_impl.super__Deque_impl_data._M_start._M_last =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
          local_e8._M_impl.super__Deque_impl_data._M_start._M_first =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_e8._M_impl.super__Deque_impl_data._M_start._M_node =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
      }
    }
    if (height_left != 0) {
      pDVar14 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pDVar4 = (widgets->
               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      ppuVar9 = local_e8._M_impl.super__Deque_impl_data._M_start._M_node;
      if (pDVar14 == pDVar4) {
        local_78 = 0.0;
        dStack_70 = 0.0;
      }
      else {
        lVar17 = 0;
        do {
          TVar3 = (pDVar14->widget->height_policy).type_;
          if ((TVar3 < (Ignored|Minimum)) && ((0x4aU >> (TVar3 & 0x1f) & 1) != 0)) {
            lVar17 = lVar17 + (pDVar14->widget->height_policy).stretch_;
          }
          pDVar14 = pDVar14 + 1;
        } while (pDVar14 != pDVar4);
        auVar23._8_4_ = (int)((ulong)lVar17 >> 0x20);
        auVar23._0_8_ = lVar17;
        auVar23._12_4_ = 0x45300000;
        dStack_70 = auVar23._8_8_ - 1.9342813113834067e+25;
        local_78 = dStack_70 + ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0);
      }
      for (; ppuVar9 < ppuVar13; ppuVar9 = ppuVar9 + 1) {
        operator_delete(ppuVar9[1],0x200);
      }
      local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = puVar15;
      local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = puVar10;
      local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = puVar11;
      local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = ppuVar12;
      pDVar14 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pDVar4 = (widgets->
               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar20 = pDVar14 == pDVar4;
      if (!bVar20) {
        local_90 = (double)height_left;
        iVar16 = 0;
        do {
          TVar3 = (pDVar14->widget->height_policy).type_;
          if ((TVar3 < (Ignored|Minimum)) && ((0x4aU >> (TVar3 & 0x1f) & 1) != 0)) {
            sVar2 = (pDVar14->widget->width_policy).stretch_;
            auVar24._0_8_ = (double)CONCAT44(0x43300000,(int)sVar2);
            auVar24._8_4_ = (int)(sVar2 >> 0x20);
            auVar24._12_4_ = 0x45300000;
            dVar25 = (((auVar24._8_8_ - 1.9342813113834067e+25) +
                      (auVar24._0_8_ - 4503599627370496.0)) / local_78) * local_90;
            local_88 = (ulong)dVar25;
            local_88 = (long)(dVar25 - 9.223372036854776e+18) & (long)local_88 >> 0x3f | local_88;
            if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_push_back_aux<unsigned_long>
                        ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,&local_88
                        );
            }
            else {
              *local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_88;
              local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
            uVar19 = *pDVar14->height;
            puVar15 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              puVar15 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            uVar5 = (pDVar14->widget->height_policy).max_;
            if (puVar15[-1] + uVar19 <= uVar5) goto LAB_0014512d;
            *pDVar14->height = uVar5;
            pDVar6 = (widgets->
                     super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pDVar7 = (widgets->
                     super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            pDVar18 = pDVar6 + (long)iVar16 + 1;
            if (pDVar18 != pDVar7) {
              memmove(pDVar6 + iVar16,pDVar18,(long)pDVar7 - (long)pDVar18);
            }
            ppDVar1 = &(widgets->
                       super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppDVar1 = *ppDVar1 + -1;
            std::
            vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            ::vector(&local_60,widgets);
            height_left = height_left + ((int)uVar19 - (int)uVar5);
            distribute_space(local_68,&local_60,height_left);
            if (local_60.
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.
                              super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_60.
                                    super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_60.
                                    super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            bVar8 = false;
          }
          else {
LAB_0014512d:
            iVar16 = iVar16 + 1;
            bVar8 = true;
          }
          if (!bVar8) break;
          pDVar14 = pDVar14 + 1;
          bVar20 = pDVar14 == pDVar4;
        } while (!bVar20);
      }
      if (bVar20) {
        pDVar4 = (widgets->
                 super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pDVar14 = (widgets->
                       super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                       )._M_impl.super__Vector_impl_data._M_start; pDVar14 != pDVar4;
            pDVar14 = pDVar14 + 1) {
          TVar3 = (pDVar14->widget->height_policy).type_;
          if ((TVar3 < (Ignored|Minimum)) && ((0x4aU >> (TVar3 & 0x1f) & 1) != 0)) {
            *pDVar14->height =
                 *pDVar14->height + *local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
            height_left = height_left -
                          (int)*local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
            if (local_e8._M_impl.super__Deque_impl_data._M_start._M_cur ==
                local_e8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
              operator_delete(local_e8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
              local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_e8._M_impl.super__Deque_impl_data._M_start._M_node[1];
              local_e8._M_impl.super__Deque_impl_data._M_start._M_last =
                   local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
              local_e8._M_impl.super__Deque_impl_data._M_start._M_first =
                   local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_e8._M_impl.super__Deque_impl_data._M_start._M_node =
                   local_e8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
            }
            else {
              local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
            }
          }
        }
        if (height_left != 0) {
          pDVar14 = (widgets->
                    super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pDVar4 = (widgets->
                   super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          pDVar6 = pDVar14;
          iVar16 = height_left;
          do {
            for (; pDVar6 != pDVar4; pDVar6 = pDVar6 + 1) {
              if ((((pDVar6->widget->height_policy).type_ & ~Minimum) == Expanding) &&
                 (0 < height_left)) {
                uVar19 = *pDVar6->height + 1;
                if (uVar19 <= (pDVar6->widget->height_policy).max_) {
                  *pDVar6->height = uVar19;
                  height_left = height_left + -1;
                }
              }
            }
            bVar20 = iVar16 != height_left;
            pDVar6 = pDVar14;
            iVar16 = height_left;
          } while (bVar20);
          do {
            for (; pDVar6 != pDVar4; pDVar6 = pDVar6 + 1) {
              TVar3 = (pDVar6->widget->height_policy).type_;
              if ((TVar3 == Ignored || (TVar3 & ~Maximum) == Minimum) && (0 < height_left)) {
                uVar19 = *pDVar6->height + 1;
                if (uVar19 <= (pDVar6->widget->height_policy).max_) {
                  *pDVar6->height = uVar19;
                  height_left = height_left + -1;
                }
              }
            }
            bVar20 = iVar16 != height_left;
            pDVar6 = pDVar14;
            iVar16 = height_left;
          } while (bVar20);
        }
      }
    }
  }
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_e8);
  return;
}

Assistant:

void Vertical::distribute_space(std::vector<Dimensions_reference> widgets,
                                int height_left) {
    // Find total stretch of first group
    std::size_t total_stretch{0};
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Expanding ||
            policy == Size_policy::MinimumExpanding) {
            total_stretch += d.widget->height_policy.stretch();
        }
    }

    // Calculate new heights of widgets in new group, if any go over max_height
    // then assign max value and recurse without that widget in vector.
    std::deque<std::size_t> height_additions;
    int index{0};
    auto to_distribute = height_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Expanding ||
            policy == Size_policy::MinimumExpanding) {
            height_additions.push_back((d.widget->height_policy.stretch() /
                                        static_cast<double>(total_stretch)) *
                                       to_distribute);
            if ((*d.height + height_additions.back()) >
                d.widget->height_policy.max_size()) {
                height_left += d.widget->height_policy.max_size() - *d.height;
                *d.height = d.widget->height_policy.max_size();
                widgets.erase(std::begin(widgets) + index);
                return distribute_space(widgets, height_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign calculated
    // values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Expanding ||
            policy == Size_policy::MinimumExpanding) {
            *d.height += height_additions.front();
            height_left -= height_additions.front();
            height_additions.pop_front();
        }
    }

    // SECOND GROUP - duplicate of above dependent on Policies to work with.
    // Preferred and Minimum
    if (height_left == 0) {
        return;
    }
    // Find total stretch
    total_stretch = 0;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Preferred ||
            policy == Size_policy::Minimum || policy == Size_policy::Ignored) {
            total_stretch += d.widget->height_policy.stretch();
        }
    }

    // Calculate new heights of widgets in new group, if any go over max_height
    // then assign max value and recurse without that widget in vector.
    height_additions.clear();
    index = 0;
    to_distribute = height_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Preferred ||
            policy == Size_policy::Minimum || policy == Size_policy::Ignored) {
            height_additions.push_back((d.widget->width_policy.stretch() /
                                        static_cast<double>(total_stretch)) *
                                       to_distribute);
            if ((*d.height + height_additions.back()) >
                d.widget->height_policy.max_size()) {
                height_left -= d.widget->height_policy.max_size() - *d.height;
                *d.height = d.widget->height_policy.max_size();
                widgets.erase(std::begin(widgets) + index);
                return distribute_space(widgets, height_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign calculated
    // values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Preferred ||
            policy == Size_policy::Minimum || policy == Size_policy::Ignored) {
            *d.height += height_additions.front();
            height_left -= height_additions.front();
            height_additions.pop_front();
        }
    }
    if (height_left == 0) {
        return;
    }
    // Rounding error extra
    // First Group
    auto height_check{0};
    do {
        height_check = height_left;
        for (Dimensions_reference& d : widgets) {
            auto policy = d.widget->height_policy.type();
            if ((policy == Size_policy::Expanding ||
                 policy == Size_policy::MinimumExpanding) &&
                height_left > 0) {
                if (*d.height + 1 <= d.widget->height_policy.max_size()) {
                    *d.height += 1;
                    height_left -= 1;
                }
            }
        }
    } while (height_check != height_left);

    // Second Group
    do {
        height_check = height_left;
        for (Dimensions_reference& d : widgets) {
            auto policy = d.widget->height_policy.type();
            if ((policy == Size_policy::Preferred ||
                 policy == Size_policy::Minimum ||
                 policy == Size_policy::Ignored) &&
                height_left > 0) {
                if (*d.height + 1 <= d.widget->height_policy.max_size()) {
                    *d.height += 1;
                    height_left -= 1;
                }
            }
        }
    } while (height_check != height_left);
}